

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

void skill_init(def_skill *class_skill)

{
  byte bVar1;
  obj *poVar2;
  objclass *poVar3;
  short sVar4;
  unsigned_short uVar5;
  ulong uVar6;
  objdescr *poVar7;
  char cVar8;
  skills *psVar9;
  char **ppcVar10;
  def_skill *pdVar11;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  short *psVar15;
  
  memset(u.weapon_skills,0,0xa8);
  sVar4 = urole.malenum;
  poVar3 = objects;
  for (poVar2 = invent; poVar2 != (obj *)0x0; poVar2 = poVar2->nobj) {
    if (poVar2->otyp == 0x216 && sVar4 == 0x15d) {
      uVar13 = (uint)poVar3[0x216].oc_subtyp;
LAB_00286b46:
      if (uVar13 != 0) {
        u.weapon_skills[(int)uVar13].skill = '\x02';
      }
    }
    else if (((byte)poVar2->oclass < 0xe) && ((0x2044U >> ((byte)poVar2->oclass & 0x1f) & 1) != 0))
    {
      bVar1 = poVar3[poVar2->otyp].oc_subtyp;
      bVar14 = (char)bVar1 >> 7;
      uVar13 = (uint)(byte)((bVar1 ^ bVar14) - bVar14);
      goto LAB_00286b46;
    }
  }
  if ((ushort)sVar4 < 0x161) {
    psVar9 = u.weapon_skills + 0x1f;
    if ((sVar4 != 0x15e) && (sVar4 != 0x160)) goto LAB_00286bb6;
  }
  else if (sVar4 == 0x168) {
    u.weapon_skills[0x1e].skill = '\x02';
    psVar9 = u.weapon_skills + 0x21;
  }
  else {
    if (sVar4 != 0x161) goto LAB_00286bb6;
    psVar9 = u.weapon_skills + 0x22;
  }
  psVar9->skill = '\x02';
LAB_00286bb6:
  cVar8 = class_skill->skill;
  if (cVar8 != '\0') {
    pdVar11 = class_skill + 1;
    do {
      u.weapon_skills[cVar8].max_skill = pdVar11[-1].skmax;
      if (u.weapon_skills[cVar8].skill == '\0') {
        u.weapon_skills[cVar8].skill = '\x01';
      }
      cVar8 = pdVar11->skill;
      pdVar11 = pdVar11 + 1;
    } while (cVar8 != '\0');
    if ('\x04' < u.weapon_skills[0x25].max_skill) {
      u.weapon_skills[0x25].skill = '\x02';
    }
  }
  if (urole.petnum == 0x6b) {
    u.weapon_skills[0x27].skill = '\x02';
  }
  psVar15 = skill_names_indices;
  uVar12 = 0;
  do {
    cVar8 = u.weapon_skills[uVar12].skill;
    if (cVar8 != '\0') {
      if (u.weapon_skills[uVar12].max_skill < cVar8) {
        if ((0x2ffd7bfeUL >> (uVar12 & 0x3f) & 1) == 0) {
          if (uVar12 == 0x25) {
            uVar6 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
            ppcVar10 = barehands_or_martial;
          }
          else {
            uVar6 = (ulong)(uint)-(int)*psVar15;
            ppcVar10 = odd_skill_names;
          }
          poVar7 = (objdescr *)(ppcVar10 + uVar6);
        }
        else {
          poVar7 = obj_descr + objects[*psVar15].oc_name_idx;
        }
        impossible("skill_init: curr > max: %s",poVar7->oc_name);
        cVar8 = u.weapon_skills[uVar12].skill;
        u.weapon_skills[uVar12].max_skill = cVar8;
      }
      uVar5 = (cVar8 + -1) * (cVar8 + -1) * 0x14;
      if (6 < (int)uVar12 - 0x1eU) {
        uVar5 = (unsigned_short)(100 << (cVar8 - 2U & 0x1f));
      }
      u.weapon_skills[uVar12].advance = uVar5;
    }
    uVar12 = uVar12 + 1;
    psVar15 = psVar15 + 1;
  } while (uVar12 != 0x2a);
  return;
}

Assistant:

void skill_init(const struct def_skill *class_skill)
{
	struct obj *obj;
	int skmax, skill;

	/* initialize skill array; by default, everything is restricted */
	for (skill = 0; skill < P_NUM_SKILLS; skill++) {
	    P_SKILL(skill) = P_ISRESTRICTED;
	    P_MAX_SKILL(skill) = P_ISRESTRICTED;
	    P_ADVANCE(skill) = 0;
	}

	/* Set skill for all weapons in inventory to be basic */
	for (obj = invent; obj; obj = obj->nobj) {
	    skill = weapon_type(obj);
	    if (skill != P_NONE)
		P_SKILL(skill) = P_BASIC;
	}

	/* set skills for magic */
	if (Role_if (PM_HEALER) || Role_if(PM_MONK)) {
		P_SKILL(P_HEALING_SPELL) = P_BASIC;
	} else if (Role_if (PM_PRIEST)) {
		P_SKILL(P_CLERIC_SPELL) = P_BASIC;
	} else if (Role_if (PM_WIZARD)) {
		P_SKILL(P_ATTACK_SPELL) = P_BASIC;
		P_SKILL(P_ENCHANTMENT_SPELL) = P_BASIC;
	}

	/* walk through array to set skill maximums */
	for (; class_skill->skill != P_NONE; class_skill++) {
	    skmax = class_skill->skmax;
	    skill = class_skill->skill;

	    P_MAX_SKILL(skill) = skmax;
	    if (P_SKILL(skill) == P_ISRESTRICTED)	/* skill pre-set */
		P_SKILL(skill) = P_UNSKILLED;
	}

	/* High potential fighters already know how to use their hands. */
	if (P_MAX_SKILL(P_BARE_HANDED_COMBAT) > P_EXPERT)
	    P_SKILL(P_BARE_HANDED_COMBAT) = P_BASIC;

	/* Roles that start with a horse know how to ride it */
	if (urole.petnum == PM_PONY)
	    P_SKILL(P_RIDING) = P_BASIC;

	/*
	 * Make sure we haven't missed setting the max on a skill
	 * & set advance
	 */
	for (skill = 0; skill < P_NUM_SKILLS; skill++) {
	    if (!P_RESTRICTED(skill)) {
		if (P_MAX_SKILL(skill) < P_SKILL(skill)) {
		    impossible("skill_init: curr > max: %s", P_NAME(skill));
		    P_MAX_SKILL(skill) = P_SKILL(skill);
		}
		P_ADVANCE(skill) = practice_needed_to_advance(skill, P_SKILL(skill) - 1);
	    }
	}
}